

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.h
# Opt level: O0

QRect __thiscall QRectF::toRect(QRectF *this)

{
  long lVar1;
  QRect QVar2;
  QRect *in_RDI;
  long in_FS_OFFSET;
  int nh;
  int nw;
  int nyp;
  int nxp;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  double in_stack_ffffffffffffffb0;
  double value;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::qSaturateRound<double,_true>(in_stack_ffffffffffffffb0);
  QtPrivate::qSaturateRound<double,_true>(in_stack_ffffffffffffffb0);
  value = 0.5;
  QtPrivate::qSaturateRound<double,_true>(0.5);
  QtPrivate::qSaturateRound<double,_true>(value);
  QRect::QRect(in_RDI,(int)((ulong)value >> 0x20),SUB84(value,0),in_stack_ffffffffffffffac,
               in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = local_10;
    QVar2._0_8_ = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

constexpr inline QRect QRectF::toRect() const noexcept
{
    // This rounding is designed to minimize the maximum possible difference
    // in topLeft(), bottomRight(), and size() after rounding.
    // All dimensions are at most off by 0.75, and topLeft by at most 0.5.
    const int nxp = QtPrivate::qSaturateRound(xp);
    const int nyp = QtPrivate::qSaturateRound(yp);
    const int nw = QtPrivate::qSaturateRound(w + (xp - nxp) / 2);
    const int nh = QtPrivate::qSaturateRound(h + (yp - nyp) / 2);
    return QRect(nxp, nyp, nw, nh);
}